

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

bool __thiscall
hwtest::pgraph::anon_unknown_17::MthdSurfDvdFormat::is_valid_val(MthdSurfDvdFormat *this)

{
  uint uVar1;
  int sfmt;
  MthdSurfDvdFormat *this_local;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val >> 0x10;
  if ((uVar1 == 0) || (2 < uVar1)) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = 0xe01f;
    if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x88) {
      uVar1 = 0x3f;
    }
    if ((((this->super_SingleMthdTest).super_MthdTest.val & uVar1) == 0) &&
       (((this->super_SingleMthdTest).super_MthdTest.val & 0xffff) != 0)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		int sfmt = extr(val, 16, 16);
		if (sfmt == 0 || sfmt > 2)
			return false;
		if (val & (cls == 0x88 ? 0x3f : 0xe01f) || !(val & 0xffff))
			return false;
		return true;
	}